

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShLinkExt(ShHandle linkHandle,ShHandle *compHandles,int numHandles)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  reference ppTVar4;
  long *plVar5;
  TPoolAllocator *poolAllocator;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  int local_7c;
  bool ret;
  int i_1;
  TLinker *linker;
  TShHandleBase *base;
  value_type local_60;
  long *local_58;
  TShHandleBase *base_1;
  undefined1 local_48 [4];
  int i;
  THandleList cObjects;
  int numHandles_local;
  ShHandle *compHandles_local;
  ShHandle linkHandle_local;
  
  if ((linkHandle == (ShHandle)0x0) || (numHandles == 0)) {
    linkHandle_local._4_4_ = 0;
  }
  else {
    cObjects.super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
    super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = numHandles;
    glslang::TVector<TShHandleBase_*>::TVector((TVector<TShHandleBase_*> *)local_48);
    for (base_1._4_4_ = 0;
        base_1._4_4_ <
        cObjects.super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
        super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; base_1._4_4_ = base_1._4_4_ + 1) {
      if (compHandles[base_1._4_4_] == (ShHandle)0x0) {
        linkHandle_local._4_4_ = 0;
        goto LAB_004dd50b;
      }
      local_58 = (long *)compHandles[base_1._4_4_];
      lVar3 = (**(code **)(*local_58 + 0x18))();
      if (lVar3 != 0) {
        local_60 = (value_type)(**(code **)(*local_58 + 0x18))();
        std::vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>::push_back
                  ((vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_> *)local_48,
                   &local_60);
      }
      lVar3 = (**(code **)(*local_58 + 0x10))();
      if (lVar3 != 0) {
        base = (TShHandleBase *)(**(code **)(*local_58 + 0x10))();
        std::vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>::push_back
                  ((vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_> *)local_48,
                   &base);
      }
      ppTVar4 = std::vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>::operator[]
                          ((vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_> *)
                           local_48,(long)base_1._4_4_);
      if (*ppTVar4 == (value_type)0x0) {
        linkHandle_local._4_4_ = 0;
        goto LAB_004dd50b;
      }
    }
    plVar5 = (long *)(**(code **)(*linkHandle + 0x18))();
    if (plVar5 == (long *)0x0) {
      linkHandle_local._4_4_ = 0;
    }
    else {
      poolAllocator = (TPoolAllocator *)(**(code **)(*plVar5 + 0x28))();
      glslang::SetThreadPoolAllocator(poolAllocator);
      glslang::TInfoSinkBase::erase((TInfoSinkBase *)plVar5[2]);
      for (local_7c = 0;
          local_7c <
          cObjects.super_vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>.
          super__Vector_base<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_; local_7c = local_7c + 1) {
        ppTVar4 = std::vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>::
                  operator[]((vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_> *)
                             local_48,(long)local_7c);
        iVar2 = (*(*ppTVar4)->_vptr_TShHandleBase[2])();
        if (CONCAT44(extraout_var,iVar2) != 0) {
          ppTVar4 = std::vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_>::
                    operator[]((vector<TShHandleBase_*,_glslang::pool_allocator<TShHandleBase_*>_> *
                               )local_48,(long)local_7c);
          iVar2 = (*(*ppTVar4)->_vptr_TShHandleBase[2])();
          uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x40))();
          if ((uVar6 & 1) == 0) {
            glslang::TInfoSinkBase::message
                      ((TInfoSinkBase *)plVar5[2],EPrefixError,
                       "Not all shaders have valid object code.");
            linkHandle_local._4_4_ = 0;
            goto LAB_004dd50b;
          }
        }
      }
      bVar1 = (**(code **)(*plVar5 + 0x38))(plVar5,local_48);
      linkHandle_local._4_4_ = (uint)((bVar1 & 1) != 0);
    }
LAB_004dd50b:
    base_1._0_4_ = 1;
    glslang::TVector<TShHandleBase_*>::~TVector((TVector<TShHandleBase_*> *)local_48);
  }
  return linkHandle_local._4_4_;
}

Assistant:

int ShLinkExt(
    const ShHandle linkHandle,
    const ShHandle compHandles[],
    const int numHandles)
{
    if (linkHandle == nullptr || numHandles == 0)
        return 0;

    THandleList cObjects;

    for (int i = 0; i < numHandles; ++i) {
        if (compHandles[i] == nullptr)
            return 0;
        TShHandleBase* base = reinterpret_cast<TShHandleBase*>(compHandles[i]);
        if (base->getAsLinker()) {
            cObjects.push_back(base->getAsLinker());
        }
        if (base->getAsCompiler())
            cObjects.push_back(base->getAsCompiler());

        if (cObjects[i] == nullptr)
            return 0;
    }

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(linkHandle);
    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());

    if (linker == nullptr)
        return 0;
    
    SetThreadPoolAllocator(linker->getPool());
    linker->infoSink.info.erase();

    for (int i = 0; i < numHandles; ++i) {
        if (cObjects[i]->getAsCompiler()) {
            if (! cObjects[i]->getAsCompiler()->linkable()) {
                linker->infoSink.info.message(EPrefixError, "Not all shaders have valid object code.");
                return 0;
            }
        }
    }

    bool ret = linker->link(cObjects);

    return ret ? 1 : 0;
}